

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::FboUtil::addExtFormats
          (FboUtil *this,FormatDB *db,FormatExtEntries extFmts,RenderContext *ctx)

{
  bool bVar1;
  ContextInfo *ctxInfo;
  _Base_ptr p_Var2;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  tokens;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExtensions;
  istringstream tokenStream;
  undefined1 local_250 [16];
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  bool local_228;
  istream_type *local_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  char local_1f8;
  FormatExtEntry *local_1f0;
  FormatDB *local_1e8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_1e0 [8];
  _Rb_tree_node_base local_1d8;
  undefined8 local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f0 = extFmts.m_end;
  local_1e8 = (FormatDB *)this;
  if (local_1f0 == (FormatExtEntry *)0x0) {
    ctxInfo = (ContextInfo *)0x0;
  }
  else {
    ctxInfo = glu::ContextInfo::create((RenderContext *)local_1f0);
  }
  if (db != (FormatDB *)extFmts.m_begin) {
    do {
      local_1d8._M_color = _S_red;
      local_1d8._M_parent = (_Base_ptr)0x0;
      local_1d8._M_left = &local_1d8;
      local_1b8 = 0;
      local_1d8._M_right = local_1d8._M_left;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_250,*(char **)&(db->m_formatFlags)._M_t._M_impl,
                 (allocator<char> *)&local_220);
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_250,_S_in);
      if ((istream_type *)local_250._0_8_ != (istream_type *)&local_240) {
        operator_delete((void *)local_250._0_8_,local_240 + 1);
      }
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                          *)local_250,(istream_type *)local_1b0);
      local_220 = (istream_type *)0x0;
      local_210 = 0;
      local_208 = 0;
      local_1f8 = '\0';
      local_218 = &local_208;
      while ((local_228 != (bool)local_1f8 ||
             ((local_228 != false && ((istream_type *)local_250._0_8_ != local_220))))) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  (local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_250 + 8));
        std::
        istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
        ::_M_read((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                   *)local_250);
      }
      if (local_218 != &local_208) {
        operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._8_8_ != &local_238) {
        operator_delete((void *)local_250._8_8_,local_238._M_allocated_capacity + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      p_Var2 = local_1d8._M_left;
      if (local_1d8._M_left != &local_1d8 && ctxInfo != (ContextInfo *)0x0) {
        do {
          bVar1 = checkExtensionSupport(ctxInfo,(RenderContext *)local_1f0,(string *)(p_Var2 + 1));
          if (!bVar1) goto LAB_017f8964;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        } while (p_Var2 != &local_1d8);
      }
      for (p_Var2 = (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var2 != (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var2 = (_Base_ptr)&p_Var2->field_0x4) {
        FormatDB::addExtensionFormat
                  (local_1e8,
                   (ImageFormat)
                   (CONCAT44(p_Var2->_M_color >> 0x10,p_Var2->_M_color) & 0xffffffff0000ffff),
                   (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e0);
      }
LAB_017f8964:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0);
      db = (FormatDB *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    } while (db != (FormatDB *)extFmts.m_begin);
  }
  if (ctxInfo != (ContextInfo *)0x0) {
    (*ctxInfo->_vptr_ContextInfo[1])(ctxInfo);
  }
  return;
}

Assistant:

void addExtFormats (FormatDB& db, FormatExtEntries extFmts, const RenderContext* ctx)
{
	const UniquePtr<ContextInfo> ctxInfo(ctx != DE_NULL ? ContextInfo::create(*ctx) : DE_NULL);
	for (const FormatExtEntry* entryIt = extFmts.begin(); entryIt != extFmts.end(); entryIt++)
	{
		bool					supported			= true;
		std::set<std::string>	requiredExtensions;

		// parse required extensions
		{
			istringstream tokenStream(string(entryIt->extensions));
			istream_iterator<string> tokens((tokenStream)), end;

			while (tokens != end)
			{
				requiredExtensions.insert(*tokens);
				++tokens;
			}
		}

		// check support
		if (ctxInfo)
		{
			for (std::set<std::string>::const_iterator extIt = requiredExtensions.begin(); extIt != requiredExtensions.end(); ++extIt)
			{
				if (!checkExtensionSupport(*ctxInfo, *ctx, *extIt))
				{
					supported = false;
					break;
				}
			}
		}

		if (supported)
			for (const FormatKey* i2 = entryIt->formats.begin(); i2 != entryIt->formats.end(); i2++)
				db.addExtensionFormat(formatKeyInfo(*i2), FormatFlags(entryIt->flags), requiredExtensions);
	}
}